

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

void despot::DESPOT::Update(VNode *vnode)

{
  bool bVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  QNode *this;
  ACT_TYPE action;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ValuedAction VVar7;
  ValuedAction VVar8;
  double local_30;
  double local_28;
  double local_20;
  
  bVar1 = VNode::IsLeaf(vnode);
  if (!bVar1) {
    VVar7 = VNode::default_move(vnode);
    VVar8 = VNode::default_move(vnode);
    local_20 = -INFINITY;
    uVar3 = 0;
    local_30 = VVar7.value;
    local_28 = VVar8.value;
    while( true ) {
      pvVar2 = VNode::children(vnode);
      if ((ulong)((long)(pvVar2->
                        super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar2->
                        super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
      this = VNode::Child(vnode,(ACT_TYPE)uVar3);
      dVar4 = QNode::lower_bound(this);
      if (dVar4 <= local_30) {
        dVar4 = local_30;
      }
      dVar5 = QNode::upper_bound(this);
      if (dVar5 <= local_28) {
        dVar5 = local_28;
      }
      dVar6 = this->utility_upper_bound;
      if (this->utility_upper_bound <= local_20) {
        dVar6 = local_20;
      }
      uVar3 = uVar3 + 1;
      local_30 = dVar4;
      local_28 = dVar5;
      local_20 = dVar6;
    }
    dVar4 = VNode::lower_bound(vnode);
    if (dVar4 < local_30) {
      VNode::lower_bound(vnode,local_30);
    }
    dVar4 = VNode::upper_bound(vnode);
    if (local_28 < dVar4) {
      VNode::upper_bound(vnode,local_28);
    }
    if (local_20 < vnode->utility_upper_bound) {
      vnode->utility_upper_bound = local_20;
    }
  }
  return;
}

Assistant:

void DESPOT::Update(VNode* vnode) {
	if (vnode->IsLeaf()) {
		return;
	}

	double lower = vnode->default_move().value;
	double upper = vnode->default_move().value;
	double utility_upper = Globals::NEG_INFTY;

	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		lower = max(lower, qnode->lower_bound());
		upper = max(upper, qnode->upper_bound());
		utility_upper = max(utility_upper, qnode->utility_upper_bound);
	}

	if (lower > vnode->lower_bound()) {
		vnode->lower_bound(lower);
	}
	if (upper < vnode->upper_bound()) {
		vnode->upper_bound(upper);
	}
	if (utility_upper < vnode->utility_upper_bound) {
		vnode->utility_upper_bound = utility_upper;
	}
}